

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall FDrawInfo::FloodLowerGap(FDrawInfo *this,seg_t *seg)

{
  line_t *plVar1;
  double dVar2;
  double dVar3;
  sector_t *psVar4;
  sector_t *sec;
  FDrawInfo *this_00;
  bool bVar5;
  wallseg local_508;
  sector_t bfake;
  sector_t ffake;
  
  psVar4 = gl_FakeFlat(seg->frontsector,&ffake,true);
  sec = gl_FakeFlat(seg->backsector,&bfake,false);
  dVar2 = secplane_t::ZatPoint(&sec->floorplane,seg->v1);
  this_00 = (FDrawInfo *)&psVar4->floorplane;
  dVar3 = secplane_t::ZatPoint((secplane_t *)this_00,seg->v1);
  if ((sec->planes[0].Texture.texnum != skyflatnum.texnum) && (sec->planes[0].TexZ <= ViewPos.Z)) {
    plVar1 = seg->linedef;
    bVar5 = seg->sidedef == plVar1->sidedef[0];
    local_508.z2 = (float)dVar3;
    local_508.y2 = (float)(*(double **)(plVar1->args + (ulong)bVar5 * 2 + -0xb))[1];
    local_508.x2 = (float)**(double **)(plVar1->args + (ulong)bVar5 * 2 + -0xb);
    local_508.x1 = (float)**(double **)(plVar1->args + (ulong)!bVar5 * 2 + -0xb);
    local_508.y1 = (float)(*(double **)(plVar1->args + (ulong)!bVar5 * 2 + -0xb))[1];
    local_508.z1 = (float)dVar2;
    SetupFloodStencil(this_00,&local_508);
    DrawFloodedPlane(this_00,&local_508,(float)dVar2,sec,false);
    ClearFloodStencil(this_00,&local_508);
  }
  return;
}

Assistant:

void FDrawInfo::FloodLowerGap(seg_t * seg)
{
	wallseg ws;
	sector_t ffake, bfake;
	sector_t * fakefsector = gl_FakeFlat(seg->frontsector, &ffake, true);
	sector_t * fakebsector = gl_FakeFlat(seg->backsector, &bfake, false);

	vertex_t * v1, * v2;

	// Although the plane can be sloped this code will only be called
	// when the edge itself is not.
	double backz = fakebsector->floorplane.ZatPoint(seg->v1);
	double frontz = fakefsector->floorplane.ZatPoint(seg->v1);


	if (fakebsector->GetTexture(sector_t::floor) == skyflatnum) return;
	if (fakebsector->GetPlaneTexZ(sector_t::floor) > ViewPos.Z) return;

	if (seg->sidedef == seg->linedef->sidedef[0])
	{
		v1=seg->linedef->v1;
		v2=seg->linedef->v2;
	}
	else
	{
		v1=seg->linedef->v2;
		v2=seg->linedef->v1;
	}

	ws.x1 = v1->fX();
	ws.y1 = v1->fY();
	ws.x2 = v2->fX();
	ws.y2 = v2->fY();

	ws.z2= frontz;
	ws.z1= backz;

	// Step1: Draw a stencil into the gap
	SetupFloodStencil(&ws);

	// Step2: Project the ceiling plane into the gap
	DrawFloodedPlane(&ws, ws.z1, fakebsector, false);

	// Step3: Delete the stencil
	ClearFloodStencil(&ws);
}